

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrature.hpp
# Opt level: O0

void __thiscall
IntegratorXX::
Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::AhrensBeylkin<double>>>
::
Quadrature<IntegratorXX::Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>const&,IntegratorXX::Quadrature<IntegratorXX::AhrensBeylkin<double>>const&,std::array<double,3ul>const&,void>
          (Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::AhrensBeylkin<double>>>
           *this,Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                 *args,Quadrature<IntegratorXX::AhrensBeylkin<double>_> *args_1,
          array<double,_3UL> *args_2)

{
  array<double,_3UL> *in_R8;
  tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_58;
  array<double,_3UL> *local_28;
  array<double,_3UL> *args_local_2;
  Quadrature<IntegratorXX::AhrensBeylkin<double>_> *args_local_1;
  Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
  *args_local;
  Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::AhrensBeylkin<double>_>_>
  *this_local;
  
  local_28 = args_2;
  args_local_2 = (array<double,_3UL> *)args_1;
  args_local_1 = (Quadrature<IntegratorXX::AhrensBeylkin<double>_> *)args;
  args_local = (Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                *)this;
  generate<IntegratorXX::Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>const&,IntegratorXX::Quadrature<IntegratorXX::AhrensBeylkin<double>>const&,std::array<double,3ul>const&>
            (&local_58,
             (Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::AhrensBeylkin<double>>>
              *)args,(Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                      *)args_1,(Quadrature<IntegratorXX::AhrensBeylkin<double>_> *)args_2,in_R8);
  Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::AhrensBeylkin<double>_>_>
  ::Quadrature((Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::AhrensBeylkin<double>_>_>
                *)this,&local_58);
  std::
  tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~tuple(&local_58);
  return;
}

Assistant:

Quadrature( Args&&... args ) :
    Quadrature( generate( std::forward<Args>(args)... ) ) { }